

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O0

int64_t choose(int64_t n,int64_t k)

{
  int64_t d;
  int64_t r;
  int64_t k_local;
  int64_t n_local;
  undefined8 local_8;
  
  if (n < k) {
    local_8 = 0;
  }
  else if (k < 0) {
    local_8 = 0;
  }
  else if (k == n) {
    local_8 = 1;
  }
  else if ((k == 0) && (n != 0)) {
    local_8 = 1;
  }
  else {
    r = 1;
    n_local = n;
    for (d = 1; d <= k; d = d + 1) {
      r = (n_local * r) / d;
      n_local = n_local + -1;
    }
    local_8 = r;
  }
  return local_8;
}

Assistant:

int64_t choose(int64_t n, int64_t k)
{
  if (k > n)
    return 0;
  if (k < 0)
    return 0;
  if (k == n)
    return 1;
  if (k == 0 && n != 0)
    return 1;
  int64_t r = 1;
  for (int64_t d = 1; d <= k; ++d)
  {
    r *= n--;
    r /= d;
  }
  return r;
}